

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O3

void __thiscall
duckdb::CatalogLookup::CatalogLookup
          (CatalogLookup *this,Catalog *catalog,string *schema_p,EntryLookupInfo *lookup_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  string *psVar4;
  undefined8 uVar5;
  
  this->catalog = catalog;
  paVar1 = &(this->schema).field_2;
  (this->schema)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (schema_p->_M_dataplus)._M_p;
  paVar2 = &schema_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&schema_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->schema).field_2 + 8) = uVar5;
  }
  else {
    (this->schema)._M_dataplus._M_p = pcVar3;
    (this->schema).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->schema)._M_string_length = schema_p->_M_string_length;
  (schema_p->_M_dataplus)._M_p = (pointer)paVar2;
  schema_p->_M_string_length = 0;
  (schema_p->field_2)._M_local_buf[0] = '\0';
  psVar4 = lookup_p->name;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar3 = (psVar4->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar3,pcVar3 + psVar4->_M_string_length);
  EntryLookupInfo::EntryLookupInfo(&this->lookup_info,lookup_p,&this->name);
  return;
}

Assistant:

CatalogLookup(Catalog &catalog, string schema_p, const EntryLookupInfo &lookup_p)
	    : catalog(catalog), schema(std::move(schema_p)), name(lookup_p.GetEntryName()), lookup_info(lookup_p, name) {
	}